

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O3

XrGeneratedDispatchTableCore * RuntimeInterface::GetDispatchTable(XrInstance instance)

{
  int iVar1;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar2;
  iterator iVar3;
  mutex *__mutex;
  XrGeneratedDispatchTableCore *pXVar4;
  key_type local_18;
  
  puVar2 = GetInstance();
  __mutex = &((puVar2->_M_t).
              super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
              super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
              super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->_dispatch_table_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    puVar2 = GetInstance();
    iVar3 = std::
            _Hashtable<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(((puVar2->_M_t).
                      super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>
                      .super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->
                    _dispatch_table_map)._M_h,&local_18);
    GetInstance();
    if (iVar3.
        super__Node_iterator_base<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      pXVar4 = (XrGeneratedDispatchTableCore *)0x0;
    }
    else {
      pXVar4 = *(XrGeneratedDispatchTableCore **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_false>
                       ._M_cur + 0x10);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return pXVar4;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

const XrGeneratedDispatchTableCore* RuntimeInterface::GetDispatchTable(XrInstance instance) {
    XrGeneratedDispatchTableCore* table = nullptr;
    std::lock_guard<std::mutex> mlock(GetInstance()->_dispatch_table_mutex);
    auto it = GetInstance()->_dispatch_table_map.find(instance);
    if (it != GetInstance()->_dispatch_table_map.end()) {
        table = it->second.get();
    }
    return table;
}